

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_remove_compressor(AV1_COMP *cpi)

{
  pthread_cond_t *__cond;
  pthread_mutex_t *__mutex;
  long in_RDI;
  pthread_mutex_t *pack_bs_mt_mutex_;
  pthread_mutex_t *tpl_error_mutex_;
  pthread_mutex_t *gm_mt_mutex_;
  pthread_cond_t *enc_row_mt_cond_;
  pthread_mutex_t *enc_row_mt_mutex_;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  ExtPartController *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  pthread_mutex_t *__mutex_00;
  pthread_mutex_t *__mutex_01;
  pthread_mutex_t *__mutex_02;
  
  if (in_RDI != 0) {
    if (*(long *)(in_RDI + 0x3bfb0) != 0) {
      memset((void *)(*(long *)(in_RDI + 0x3bfb0) + 8),0x41,199);
      *(undefined1 *)(*(long *)(in_RDI + 0x3bfb0) + 0xcf) = 0;
      aom_free(in_stack_ffffffffffffffc0);
    }
    aom_free(in_stack_ffffffffffffffc0);
    __mutex_02 = *(pthread_mutex_t **)(in_RDI + 0x9afb8);
    __cond = *(pthread_cond_t **)(in_RDI + 0x9afc0);
    __mutex_01 = *(pthread_mutex_t **)(in_RDI + 0x9d170);
    __mutex = *(pthread_mutex_t **)(in_RDI + 0x9b000);
    __mutex_00 = *(pthread_mutex_t **)(in_RDI + 0x9b118);
    if (__mutex_02 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex_02);
      aom_free(__mutex_00);
    }
    if (__cond != (pthread_cond_t *)0x0) {
      pthread_cond_destroy(__cond);
      aom_free(__mutex_00);
    }
    if (__mutex_01 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex_01);
      aom_free(__mutex_00);
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex);
      aom_free(__mutex_00);
    }
    if (__mutex_00 != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex_00);
      aom_free(__mutex_00);
    }
    av1_row_mt_mem_dealloc((AV1_COMP *)&__mutex_02->__data);
    if (1 < *(int *)(in_RDI + 0x9ae48)) {
      av1_row_mt_sync_mem_dealloc((AV1EncRowMultiThreadSync *)&__mutex_00->__data);
      av1_loop_filter_dealloc((AV1LfSync *)&__mutex_00->__data);
      av1_cdef_mt_dealloc((AV1CdefSync *)0x22af65);
      av1_loop_restoration_dealloc((AV1LrSync *)&__mutex_01->__data);
      av1_tf_mt_dealloc((AV1TemporalFilterSync *)0x22af87);
    }
    dealloc_compressor_data((AV1_COMP *)&__mutex_02->__data);
    av1_ext_part_delete(in_stack_ffffffffffffffb8);
    av1_remove_common((AV1_COMMON *)0x22afac);
    aom_free(__mutex_00);
  }
  return;
}

Assistant:

void av1_remove_compressor(AV1_COMP *cpi) {
  if (!cpi) return;
#if CONFIG_RATECTRL_LOG
  if (cpi->oxcf.pass == 3) {
    rc_log_show(&cpi->rc_log);
  }
#endif  // CONFIG_RATECTRL_LOG

  AV1_COMMON *cm = &cpi->common;
  if (cm->current_frame.frame_number > 0) {
#if CONFIG_SPEED_STATS
    if (!is_stat_generation_stage(cpi)) {
      fprintf(stdout, "tx_search_count = %d\n", cpi->tx_search_count);
    }
#endif  // CONFIG_SPEED_STATS

#if CONFIG_COLLECT_PARTITION_STATS == 2
    if (!is_stat_generation_stage(cpi)) {
      av1_print_fr_partition_timing_stats(&cpi->partition_stats,
                                          "fr_part_timing_data.csv");
    }
#endif
  }

#if CONFIG_AV1_TEMPORAL_DENOISING
  av1_denoiser_free(&(cpi->denoiser));
#endif

  if (cm->error) {
    // Help detect use after free of the error detail string.
    memset(cm->error->detail, 'A', sizeof(cm->error->detail) - 1);
    cm->error->detail[sizeof(cm->error->detail) - 1] = '\0';
    aom_free(cm->error);
  }
  aom_free(cpi->td.tctx);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *const enc_row_mt_mutex_ = mt_info->enc_row_mt.mutex_;
  pthread_cond_t *const enc_row_mt_cond_ = mt_info->enc_row_mt.cond_;
  pthread_mutex_t *const gm_mt_mutex_ = mt_info->gm_sync.mutex_;
  pthread_mutex_t *const tpl_error_mutex_ = mt_info->tpl_row_mt.mutex_;
  pthread_mutex_t *const pack_bs_mt_mutex_ = mt_info->pack_bs_sync.mutex_;
  if (enc_row_mt_mutex_ != NULL) {
    pthread_mutex_destroy(enc_row_mt_mutex_);
    aom_free(enc_row_mt_mutex_);
  }
  if (enc_row_mt_cond_ != NULL) {
    pthread_cond_destroy(enc_row_mt_cond_);
    aom_free(enc_row_mt_cond_);
  }
  if (gm_mt_mutex_ != NULL) {
    pthread_mutex_destroy(gm_mt_mutex_);
    aom_free(gm_mt_mutex_);
  }
  if (tpl_error_mutex_ != NULL) {
    pthread_mutex_destroy(tpl_error_mutex_);
    aom_free(tpl_error_mutex_);
  }
  if (pack_bs_mt_mutex_ != NULL) {
    pthread_mutex_destroy(pack_bs_mt_mutex_);
    aom_free(pack_bs_mt_mutex_);
  }
#endif
  av1_row_mt_mem_dealloc(cpi);

  if (mt_info->num_workers > 1) {
    av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
    av1_loop_filter_dealloc(&mt_info->lf_row_sync);
    av1_cdef_mt_dealloc(&mt_info->cdef_sync);
#if !CONFIG_REALTIME_ONLY
    av1_loop_restoration_dealloc(&mt_info->lr_row_sync);
    av1_tf_mt_dealloc(&mt_info->tf_sync);
#endif
  }

#if CONFIG_THREE_PASS
  av1_free_thirdpass_ctx(cpi->third_pass_ctx);

  av1_close_second_pass_log(cpi);
#endif

  dealloc_compressor_data(cpi);

  av1_ext_part_delete(&cpi->ext_part_controller);

  av1_remove_common(cm);

  aom_free(cpi);

#ifdef OUTPUT_YUV_REC
  fclose(yuv_rec_file);
#endif

#ifdef OUTPUT_YUV_DENOISED
  fclose(yuv_denoised_file);
#endif
}